

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
basic_cbor_encoder(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                  binary_stream_sink *sink,cbor_encode_options *options,allocator<char> *alloc)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  
  (this->super_basic_json_visitor<char>)._vptr_basic_json_visitor =
       (_func_int **)&PTR__basic_cbor_encoder_0099aa58;
  binary_stream_sink::binary_stream_sink(&this->sink_,sink);
  *(undefined4 *)&(this->options_).field_0x18 =
       *(undefined4 *)(&options->use_stringref_ + (long)options->_vptr_cbor_encode_options[-3]);
  (this->options_)._vptr_cbor_encode_options = (_func_int **)0x999ca8;
  *(undefined8 *)&(this->options_).field_0x10 = 0x999cd0;
  bVar2 = options->use_typed_arrays_;
  (this->options_).use_stringref_ = options->use_stringref_;
  (this->options_).use_typed_arrays_ = bVar2;
  (this->stack_).
  super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->stack_).
  super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->stack_).
  super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->stringref_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->stringref_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stringref_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->stringref_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->stringref_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->stringref_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->bytestringref_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->bytestringref_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bytestringref_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->bytestringref_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->bytestringref_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  this->nesting_depth_ = 0;
  (this->bytestringref_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->next_stringref_ = 0;
  if (options->use_stringref_ == true) {
    write_tag(this,0x100);
  }
  return;
}

Assistant:

basic_cbor_encoder(Sink&& sink, 
                       const cbor_encode_options& options, 
                       const Allocator& alloc = Allocator())
       : sink_(std::forward<Sink>(sink)), 
         options_(options), 
         alloc_(alloc),
         stack_(alloc),
         stringref_map_(alloc),
         bytestringref_map_(alloc)
    {
        if (options.pack_strings())
        {
            write_tag(256);
        }
    }